

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall
fmt::v7::detail::float_writer<char>::prettify<char*>(float_writer<char> *this,char *it)

{
  char *__s;
  int iVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  size_t __len;
  char *pcVar8;
  byte *__s_00;
  byte *pbVar9;
  char *pcVar10;
  ptrdiff_t _Num;
  ulong __n;
  uint uVar11;
  size_t sVar12;
  uint uVar13;
  uint uVar14;
  ptrdiff_t _Num_1;
  
  iVar1 = this->num_digits_;
  uVar13 = this->exp_ + iVar1;
  if ((this->specs_).field_0x4 == '\x01') {
    *it = *this->digits_;
    iVar1 = this->num_digits_;
    iVar5 = (this->specs_).precision;
    if ((iVar1 < 2) && (((this->specs_).field_0x6 & 0x10) == 0)) {
      pcVar8 = it + 1;
      iVar6 = iVar1;
    }
    else {
      it[1] = this->decimal_point_;
      pcVar8 = it + 2;
      iVar6 = this->num_digits_;
    }
    uVar11 = iVar5 - iVar1;
    if (iVar6 != 1) {
      memmove(pcVar8,this->digits_ + 1,(long)iVar6 - 1U);
    }
    __s_00 = (byte *)(pcVar8 + ((long)iVar6 - 1U));
    uVar14 = *(uint *)&(this->specs_).field_0x4;
    pbVar9 = __s_00;
    if ((uVar14 >> 0x14 & 1) != 0 && 0 < (int)uVar11) {
      pbVar9 = __s_00 + uVar11;
      memset(__s_00,0x30,(ulong)uVar11);
      uVar14 = *(uint *)&(this->specs_).field_0x4;
    }
    *pbVar9 = ((uVar14 >> 0x10 & 1) == 0) << 5 | 0x45;
    pcVar8 = write_exponent<char,char*>(uVar13 - 1,(char *)(pbVar9 + 1));
    return pcVar8;
  }
  if (this->exp_ < 0) {
    if ((int)uVar13 < 1) {
      *it = '0';
      uVar14 = -uVar13;
      uVar11 = this->num_digits_;
      if (uVar11 == 0) {
        uVar2 = (this->specs_).precision;
        uVar4 = uVar14;
        if (SBORROW4(uVar2,uVar14) != (int)(uVar2 + uVar13) < 0) {
          uVar4 = uVar2;
        }
        if (-1 < (int)uVar2) {
          uVar14 = uVar4;
        }
      }
      uVar13 = *(uint *)&(this->specs_).field_0x4 & 0x100000;
      if (0 < (int)uVar11 && (char)(uVar13 >> 0x14) == '\0') {
        do {
          if (this->digits_[(ulong)uVar11 - 1] != '0') goto LAB_002152a8;
          bVar3 = 1 < (int)uVar11;
          uVar11 = uVar11 - 1;
        } while (bVar3);
        uVar11 = 0;
      }
LAB_002152a8:
      if ((uVar13 == 0 && uVar14 == 0) && uVar11 == 0) {
        pcVar8 = it + 1;
      }
      else {
        it[1] = this->decimal_point_;
        pcVar10 = it + 2;
        pcVar8 = pcVar10;
        if (0 < (int)uVar14) {
          pcVar8 = pcVar10 + uVar14;
          memset(pcVar10,0x30,(ulong)uVar14);
        }
        if (uVar11 != 0) {
          memmove(pcVar8,this->digits_,(long)(int)uVar11);
        }
        pcVar8 = pcVar8 + (int)uVar11;
      }
    }
    else {
      __n = (ulong)uVar13;
      memmove(it,this->digits_,__n);
      pcVar8 = it + __n;
      if (((this->specs_).field_0x6 & 0x10) == 0) {
        uVar11 = this->num_digits_;
        lVar7 = (long)(int)uVar11;
        uVar14 = uVar13;
        if ((int)uVar11 < (int)uVar13) {
          uVar14 = uVar11;
        }
        for (; (long)__n < lVar7; lVar7 = lVar7 + -1) {
          if (this->digits_[lVar7 + -1] != '0') {
            uVar14 = (uint)lVar7;
            break;
          }
        }
        if (uVar14 == uVar13) {
          sVar12 = (long)(int)uVar14 - __n;
        }
        else {
          *pcVar8 = this->decimal_point_;
          pcVar8 = pcVar8 + 1;
          sVar12 = (long)(int)uVar14 - __n;
          memmove(pcVar8,this->digits_ + __n,sVar12);
        }
        pcVar8 = pcVar8 + sVar12;
      }
      else {
        *pcVar8 = this->decimal_point_;
        sVar12 = (long)this->num_digits_ - __n;
        if (this->num_digits_ != uVar13) {
          memmove(pcVar8 + 1,this->digits_ + __n,sVar12);
          uVar13 = this->num_digits_;
        }
        pcVar8 = pcVar8 + 1 + sVar12;
        iVar1 = (this->specs_).precision;
        uVar11 = iVar1 - uVar13;
        if ((uVar11 != 0 && (int)uVar13 <= iVar1) && (uVar11 != 0 && (int)uVar13 <= iVar1)) {
          memset(pcVar8,0x30,(ulong)uVar11);
          pcVar8 = pcVar8 + uVar11;
        }
      }
    }
  }
  else {
    if (iVar1 == 0) {
      iVar5 = 0;
    }
    else {
      memmove(it,this->digits_,(long)iVar1);
      iVar5 = this->num_digits_;
    }
    pcVar8 = it + iVar1;
    uVar11 = uVar13 - iVar5;
    pcVar10 = pcVar8;
    if (uVar11 != 0 && iVar5 <= (int)uVar13) {
      pcVar10 = pcVar8 + uVar11;
      memset(pcVar8,0x30,(ulong)uVar11);
    }
    if ((((this->specs_).field_0x6 & 0x10) != 0) || (pcVar8 = pcVar10, (this->specs_).precision < 0)
       ) {
      __s = pcVar10 + 1;
      *pcVar10 = this->decimal_point_;
      iVar1 = (this->specs_).precision;
      uVar11 = iVar1 - uVar13;
      if (uVar11 == 0 || iVar1 < (int)uVar13) {
        pcVar8 = __s;
        if ((this->specs_).field_0x4 != '\x02') {
          pcVar10[1] = '0';
          pcVar8 = pcVar10 + 2;
        }
      }
      else {
        pcVar8 = __s + uVar11;
        memset(__s,0x30,(ulong)uVar11);
      }
    }
  }
  return pcVar8;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FMT_FUZZ
        if (num_zeros > 5000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }